

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadSafeFramesQueue.hpp
# Opt level: O1

void __thiscall
ThreadSafeFramesQueue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>::Push
          (ThreadSafeFramesQueue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
           *this,pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_> *entry)

{
  _Map_pointer pppVar1;
  int iVar2;
  undefined8 uVar3;
  pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_> elem;
  pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_> pStack_a8;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar2 == 0) {
    while (pppVar1 = (this->
                     super_queue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>_>
                     ).c.
                     super__Deque_base<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node,
          this->maxDepth <=
          ((long)(this->
                 super_queue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>_>
                 ).c.
                 super__Deque_base<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last -
           (long)(this->
                 super_queue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>_>
                 ).c.
                 super__Deque_base<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x1111111111111111 +
          ((long)(this->
                 super_queue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>_>
                 ).c.
                 super__Deque_base<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)(this->
                 super_queue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>_>
                 ).c.
                 super__Deque_base<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x1111111111111111 +
          (((long)pppVar1 -
            (long)(this->
                  super_queue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>_>
                  ).c.
                  super__Deque_base<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
          (ulong)(pppVar1 == (_Map_pointer)0x0)) * 4) {
      cv::Mat::Mat(&pStack_a8.first);
      pStack_a8.second.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pStack_a8.second.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pStack_a8.second.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Pop(this,&pStack_a8);
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&pStack_a8.second);
      cv::Mat::~Mat(&pStack_a8.first);
    }
    std::
    deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>
    ::push_back((deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>
                 *)this,entry);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    return;
  }
  uVar3 = std::__throw_system_error(iVar2);
  __clang_call_terminate(uVar3);
}

Assistant:

void Push(const T& entry) noexcept {
    std::lock_guard<std::mutex> lock(mtx);
    //! remove elements that are too old
    while (this->size() >= maxDepth) {
      T elem;
      static_cast<void>(Pop(elem));
    }
    this->push(entry);
  }